

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sopr.cc
# Opt level: O2

void anon_unknown.dwarf_3ecb::PrintUsage(ostream *stream)

{
  ostream *poVar1;
  
  std::endl<char,std::char_traits<char>>(stream);
  poVar1 = std::operator<<(stream," sopr - perform scalar operations");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(stream);
  poVar1 = std::operator<<(stream,"  usage:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       sopr [ options ] [ infile ] > stdout");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"  options:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -a a         : addition             (double)[  N/A][      x + a ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -s s         : subtraction          (double)[  N/A][      x - s ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -m m         : multiplication       (double)[  N/A][      x * m ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -d d         : division             (double)[  N/A][      x / d ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -r r         : modulo               (double)[  N/A][      x % r ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -p p         : power                (double)[  N/A][      x ^ p ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -l l         : lower bounding       (double)[  N/A][  max(x, l) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -u u         : upper bounding       (double)[  N/A][  min(x, u) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -ABS         : absolute                            [        |x| ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -INV         : inverse                             [      1 / x ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -SQR         : square                              [      x ^ 2 ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -SQRT        : square root                         [    x ^ 0.5 ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -LN          : natural logarithm                   [      ln(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -LOG2        : base 2 logarithm                    [    log2(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -LOG10       : base 10 logarithm                   [   log10(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -LOGX X      : base X logarithm     (double)[  N/A][    logX(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -EXP         : exponential                         [      e ^ x ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -POW2        : power of 2                          [      2 ^ x ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -POW10       : power of 10                         [     10 ^ x ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -POWX X      : power of X           (double)[  N/A][      X ^ x ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -FLOOR       : flooring                            [   floor(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -CEIL        : ceiling                             [    ceil(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -ROUND       : rounding                            [   round(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -ROUNDUP     : rounding up                         [ roundup(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -ROUNDDOWN   : rounding down                       [     int(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -UNIT        : unit step                           [       u(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -RAMP        : rectifier                           [   x * u(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -SIGN        : sign                                [     sgn(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -SIN         : sine                                [     sin(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -COS         : cosine                              [     cos(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -TAN         : tangent                             [     tan(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -ASIN        : arcsine                             [    asin(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -ACOS        : arccosine                           [    acos(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -ATAN        : arctangent                          [    atan(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -TANH        : hyperbolic tangent                  [    tanh(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -ATANH       : hyperbolic arctangent               [   atanh(x) ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -magic magic : remove magic number  (double)[  N/A][            ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       -MAGIC MAGIC : replace magic number (double)[  N/A][      MAGIC ]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       -h           : print this message");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,
                           "       the following strings can be used as the argument of -a, -s, -m,"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       -d, -p, -l, -u, -magic, or -MAGIC option:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"           pi       : 3.14159265...");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"           dB       :   20 / ln(10)");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"           cent     : 1200 / ln(2)");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"           semitone :   12 / ln(2)");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"           octave   :    1 / ln(2)");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"           sqrtX    :      sqrt(X)  [ 0.0 <= X <=   ]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"           lnX      :        ln(X)  [ 0.0 <  X <=   ]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"           expX     :       exp(X)  [     <= X <=   ]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       they are case-insensitive");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"  infile:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       data sequence                       (double)[stdin]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"  stdout:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       data sequence after operations      (double)");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"  notice:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(stream,"       if -MAGIC is given before -magic is given, return error");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(stream);
  poVar1 = std::operator<<(stream," SPTK: version ");
  poVar1 = std::operator<<(poVar1,"4.3");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(stream);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " sopr - perform scalar operations" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       sopr [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -a a         : addition             (double)[  N/A][      x + a ]" << std::endl;  // NOLINT
  *stream << "       -s s         : subtraction          (double)[  N/A][      x - s ]" << std::endl;  // NOLINT
  *stream << "       -m m         : multiplication       (double)[  N/A][      x * m ]" << std::endl;  // NOLINT
  *stream << "       -d d         : division             (double)[  N/A][      x / d ]" << std::endl;  // NOLINT
  *stream << "       -r r         : modulo               (double)[  N/A][      x % r ]" << std::endl;  // NOLINT
  *stream << "       -p p         : power                (double)[  N/A][      x ^ p ]" << std::endl;  // NOLINT
  *stream << "       -l l         : lower bounding       (double)[  N/A][  max(x, l) ]" << std::endl;  // NOLINT
  *stream << "       -u u         : upper bounding       (double)[  N/A][  min(x, u) ]" << std::endl;  // NOLINT
  *stream << "       -ABS         : absolute                            [        |x| ]" << std::endl;  // NOLINT
  *stream << "       -INV         : inverse                             [      1 / x ]" << std::endl;  // NOLINT
  *stream << "       -SQR         : square                              [      x ^ 2 ]" << std::endl;  // NOLINT
  *stream << "       -SQRT        : square root                         [    x ^ 0.5 ]" << std::endl;  // NOLINT
  *stream << "       -LN          : natural logarithm                   [      ln(x) ]" << std::endl;  // NOLINT
  *stream << "       -LOG2        : base 2 logarithm                    [    log2(x) ]" << std::endl;  // NOLINT
  *stream << "       -LOG10       : base 10 logarithm                   [   log10(x) ]" << std::endl;  // NOLINT
  *stream << "       -LOGX X      : base X logarithm     (double)[  N/A][    logX(x) ]" << std::endl;  // NOLINT
  *stream << "       -EXP         : exponential                         [      e ^ x ]" << std::endl;  // NOLINT
  *stream << "       -POW2        : power of 2                          [      2 ^ x ]" << std::endl;  // NOLINT
  *stream << "       -POW10       : power of 10                         [     10 ^ x ]" << std::endl;  // NOLINT
  *stream << "       -POWX X      : power of X           (double)[  N/A][      X ^ x ]" << std::endl;  // NOLINT
  *stream << "       -FLOOR       : flooring                            [   floor(x) ]" << std::endl;  // NOLINT
  *stream << "       -CEIL        : ceiling                             [    ceil(x) ]" << std::endl;  // NOLINT
  *stream << "       -ROUND       : rounding                            [   round(x) ]" << std::endl;  // NOLINT
  *stream << "       -ROUNDUP     : rounding up                         [ roundup(x) ]" << std::endl;  // NOLINT
  *stream << "       -ROUNDDOWN   : rounding down                       [     int(x) ]" << std::endl;  // NOLINT
  *stream << "       -UNIT        : unit step                           [       u(x) ]" << std::endl;  // NOLINT
  *stream << "       -RAMP        : rectifier                           [   x * u(x) ]" << std::endl;  // NOLINT
  *stream << "       -SIGN        : sign                                [     sgn(x) ]" << std::endl;  // NOLINT
  *stream << "       -SIN         : sine                                [     sin(x) ]" << std::endl;  // NOLINT
  *stream << "       -COS         : cosine                              [     cos(x) ]" << std::endl;  // NOLINT
  *stream << "       -TAN         : tangent                             [     tan(x) ]" << std::endl;  // NOLINT
  *stream << "       -ASIN        : arcsine                             [    asin(x) ]" << std::endl;  // NOLINT
  *stream << "       -ACOS        : arccosine                           [    acos(x) ]" << std::endl;  // NOLINT
  *stream << "       -ATAN        : arctangent                          [    atan(x) ]" << std::endl;  // NOLINT
  *stream << "       -TANH        : hyperbolic tangent                  [    tanh(x) ]" << std::endl;  // NOLINT
  *stream << "       -ATANH       : hyperbolic arctangent               [   atanh(x) ]" << std::endl;  // NOLINT
  *stream << "       -magic magic : remove magic number  (double)[  N/A][            ]" << std::endl;  // NOLINT
  *stream << "       -MAGIC MAGIC : replace magic number (double)[  N/A][      MAGIC ]" << std::endl;  // NOLINT
  *stream << "       -h           : print this message" << std::endl;
  *stream << "" << std::endl;
  *stream << "       the following strings can be used as the argument of -a, -s, -m," << std::endl;  // NOLINT
  *stream << "       -d, -p, -l, -u, -magic, or -MAGIC option:" << std::endl;
  *stream << "" << std::endl;
  *stream << "           pi       : 3.14159265..." << std::endl;
  *stream << "           dB       :   20 / ln(10)" << std::endl;
  *stream << "           cent     : 1200 / ln(2)" << std::endl;
  *stream << "           semitone :   12 / ln(2)" << std::endl;
  *stream << "           octave   :    1 / ln(2)" << std::endl;
  *stream << "           sqrtX    :      sqrt(X)  [ 0.0 <= X <=   ]" << std::endl;  // NOLINT
  *stream << "           lnX      :        ln(X)  [ 0.0 <  X <=   ]" << std::endl;  // NOLINT
  *stream << "           expX     :       exp(X)  [     <= X <=   ]" << std::endl;  // NOLINT
  *stream << "" << std::endl;
  *stream << "       they are case-insensitive" << std::endl;
  *stream << "" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       data sequence                       (double)[stdin]" << std::endl;  // NOLINT
  *stream << "  stdout:" << std::endl;
  *stream << "       data sequence after operations      (double)" << std::endl;
  *stream << "  notice:" << std::endl;
  *stream << "       if -MAGIC is given before -magic is given, return error" << std::endl;  // NOLINT
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}